

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PollerEpoll.cpp
# Opt level: O0

void __thiscall Liby::PollerEpoll::loop_once(PollerEpoll *this,Timestamp *param_1)

{
  int __epfd;
  ulong uVar1;
  epoll_event *__events;
  size_type sVar2;
  Logger *pLVar3;
  reference pvVar4;
  Channel *this_00;
  double __x;
  double __x_00;
  Channel *ch;
  int fd;
  anon_class_8_1_8991fb9c local_68;
  function<void_()> local_60;
  undefined1 local_40 [8];
  DeferCaller deferCaller;
  int i;
  int nfds;
  Timestamp *param_2_local;
  PollerEpoll *this_local;
  
  Poller::runNextLoopHandlers(&this->super_Poller);
  __epfd = this->pollerfd_;
  __events = (epoll_event *)
             std::vector<epoll_event,_std::allocator<epoll_event>_>::operator[](&this->events_,0);
  sVar2 = std::vector<epoll_event,_std::allocator<epoll_event>_>::size(&this->events_);
  deferCaller.functor_._M_invoker._4_4_ = epoll_wait(__epfd,__events,(int)sVar2,-1);
  pLVar3 = Logger::getLogger();
  std::vector<epoll_event,_std::allocator<epoll_event>_>::size(&this->events_);
  Logger::log(pLVar3,__x);
  for (deferCaller.functor_._M_invoker._0_4_ = 0;
      (int)deferCaller.functor_._M_invoker < deferCaller.functor_._M_invoker._4_4_;
      deferCaller.functor_._M_invoker._0_4_ = (int)deferCaller.functor_._M_invoker + 1) {
    local_68.this = this;
    std::function<void()>::function<Liby::PollerEpoll::loop_once(Liby::Timestamp*)::__0,void>
              ((function<void()> *)&local_60,&local_68);
    DeferCaller::DeferCaller((DeferCaller *)local_40,&local_60);
    std::function<void_()>::~function(&local_60);
    pvVar4 = std::vector<epoll_event,_std::allocator<epoll_event>_>::operator[]
                       (&this->events_,(long)(int)deferCaller.functor_._M_invoker);
    this_00 = Poller::getChannel(&this->super_Poller,(pvVar4->data).fd);
    pLVar3 = Logger::getLogger();
    Logger::log(pLVar3,__x_00);
    if (this_00 != (Channel *)0x0) {
      pvVar4 = std::vector<epoll_event,_std::allocator<epoll_event>_>::operator[]
                         (&this->events_,(long)(int)deferCaller.functor_._M_invoker);
      if ((pvVar4->events & 0x2008) == 0) {
        pvVar4 = std::vector<epoll_event,_std::allocator<epoll_event>_>::operator[]
                           (&this->events_,(long)(int)deferCaller.functor_._M_invoker);
        if ((pvVar4->events & 1) == 0) {
          pvVar4 = std::vector<epoll_event,_std::allocator<epoll_event>_>::operator[]
                             (&this->events_,(long)(int)deferCaller.functor_._M_invoker);
          if ((pvVar4->events & 4) != 0) {
            Channel::handleWritEvent(this_00);
          }
        }
        else {
          Channel::handleReadEvent(this_00);
        }
      }
      else {
        Channel::handleErroEvent(this_00);
      }
    }
    DeferCaller::~DeferCaller((DeferCaller *)local_40);
  }
  Poller::runAfterLoopHandlers(&this->super_Poller);
  uVar1 = this->eventsSize_;
  sVar2 = std::vector<epoll_event,_std::allocator<epoll_event>_>::size(&this->events_);
  if (sVar2 < uVar1) {
    std::vector<epoll_event,_std::allocator<epoll_event>_>::resize
              (&this->events_,this->eventsSize_ << 1);
  }
  return;
}

Assistant:

void PollerEpoll::loop_once(Timestamp *) {
    runNextLoopHandlers();

    int nfds = ::epoll_wait(pollerfd_, &events_[0], events_.size(), -1);
    verbose("nfds = %d events_.size() = %u", nfds, events_.size());
    for (int i = 0; i < nfds; i++) {
        DeferCaller deferCaller([this] { runNextTickHandlers(); });

        int fd = events_[i].data.fd;
        Channel *ch = getChannel(fd);
        verbose("event in chan %p", ch);
        if (ch == NULL)
            continue;
        if (events_[i].events & (EPOLLRDHUP | EPOLLERR)) {
            ch->handleErroEvent();
        } else if (events_[i].events & EPOLLIN) {
            ch->handleReadEvent();
        } else if (events_[i].events & EPOLLOUT) {
            ch->handleWritEvent();
        }
    }

    runAfterLoopHandlers();

    // update channels
    //    for(int i = 0; i < nfds; i++) {
    //        int fd = events_[i].data.fd;
    //        Channel *ch = getChannel(fd);
    //        if(ch != nullptr && ch->isEventChanged()) {
    //            ch->changeEvent();
    //            info("update channel %p %d %d", ch, ch->readable(),
    //            ch->writable());
    //            updateChanel(ch, ch->readable(), ch->writable());
    //        }
    //    }
    if (eventsSize_ > events_.size()) {
        events_.resize(eventsSize_ * 2);
    }
}